

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_remainder(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_val_t *this_00;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjList *in_RDI;
  CVmObjList *lst;
  vm_val_t quo_val;
  vm_val_t rem_val;
  char *rem_ext;
  char *quo_ext;
  char *ext2;
  vm_val_t val2;
  char *in_stack_00000138;
  char *in_stack_00000140;
  char *in_stack_00000148;
  char *in_stack_00000150;
  vm_val_t *in_stack_ffffffffffffff68;
  vm_val_t *in_stack_ffffffffffffff78;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffa8;
  vm_val_t local_38;
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_remainder::desc,1);
    __cxa_guard_release(&getp_remainder(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,(uint *)in_RDI,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff68);
  if (iVar1 == 0) {
    CVmStack::pop(&local_38);
    iVar1 = cvt_to_bignum((CVmObjBigNum *)in_stack_ffffffffffffff78,
                          (vm_obj_id_t)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff68);
    if (iVar1 == 0) {
      err_throw(0);
    }
    get_objid_ext(0);
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,local_14);
    CVmStack::push(&local_38);
    compute_init_2op((vm_val_t *)in_stack_ffffffffffffffa8.native_desc,in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98.ptr);
    CVmStack::push((vm_val_t *)&stack0xffffffffffffff90);
    compute_init_2op((vm_val_t *)in_stack_ffffffffffffffa8.native_desc,in_stack_ffffffffffffffa0,
                     (char *)in_stack_ffffffffffffff98.ptr);
    CVmStack::push((vm_val_t *)&stack0xffffffffffffffa0);
    obj = CVmObjList::create((int)((ulong)in_RDI >> 0x20),(size_t)local_20);
    vm_val_t::set_obj(local_20,obj);
    vm_objp(0);
    CVmObjList::cons_set_element(in_RDI,(size_t)local_20,(vm_val_t *)0x30678e);
    CVmObjList::cons_set_element(in_RDI,(size_t)local_20,(vm_val_t *)0x3067a2);
    compute_quotient_into(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
    CVmStack::discard(4);
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_remainder(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    const char *ext2;
    char *quo_ext;
    char *rem_ext;
    vm_val_t rem_val;
    vm_val_t quo_val;
    CVmObjList *lst;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the divisor */
    G_stk->pop(&val2);

    /* convert it to BigNumber */
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* it's not a BigNumber - throw an error */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* get the divisor's extension */
    ext2 = get_objid_ext(vmg_ val2.val.obj);

    /* push 'self' and the other value to protect against GC */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* create a quotient result value, and push it for safekeeping */
    quo_ext = compute_init_2op(vmg_ &quo_val, ext_, ext2);
    G_stk->push(&quo_val);

    /* create a remainder result value, and push it for safekeeping */
    rem_ext = compute_init_2op(vmg_ &rem_val, ext_, ext2);
    G_stk->push(&rem_val);

    /* 
     *   create a list for the return value - it will have two elements:
     *   the quotient and the remainder 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 2));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the list elements */
    lst->cons_set_element(0, &quo_val);
    lst->cons_set_element(1, &rem_val);

    /* calculate the quotient */
    compute_quotient_into(quo_ext, rem_ext, ext_, ext2);

    /* remove the GC protection */
    G_stk->discard(4);

    /* handled */
    return TRUE;
}